

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,quath *v)

{
  ostream *poVar1;
  const_reference pvVar2;
  quath *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = operator<<(poVar1,&v->real);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<tinyusdz::value::half,_3UL>::operator[](&v->imag,0);
  poVar1 = operator<<(poVar1,pvVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<tinyusdz::value::half,_3UL>::operator[](&v->imag,1);
  poVar1 = operator<<(poVar1,pvVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<tinyusdz::value::half,_3UL>::operator[](&v->imag,2);
  poVar1 = operator<<(poVar1,pvVar2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::quath &v) {
  os << "(" << v.real << ", " << v.imag[0] << ", " << v.imag[1] << ", "
     << v.imag[2] << ")";
  return os;
}